

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter.C
# Opt level: O2

int Filter::fnmatch(char *__pattern,char *__name,int __flags)

{
  uint uVar1;
  Error *this;
  int *piVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  string sStack_58;
  undefined8 local_38;
  undefined8 uStack_30;
  char *local_28;
  
  uVar1 = ::fnmatch(*(char **)__pattern,*(char **)__name,__flags << 4);
  if (uVar1 < 2) {
    return CONCAT31((int3)(uVar1 >> 8),uVar1 == 0);
  }
  this = (Error *)__cxa_allocate_exception(0x28);
  piVar2 = __errno_location();
  local_28 = strerror(*piVar2);
  local_38 = *(undefined8 *)__pattern;
  uStack_30 = *(undefined8 *)(__pattern + 8);
  fmt.size_ = 0xcd;
  fmt.data_ = (char *)0x19;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_38;
  ::fmt::v10::vformat_abi_cxx11_(&sStack_58,(v10 *)"Invalid pattern \"{}\" : {}",fmt,args);
  Error::Error(this,&sStack_58);
  __cxa_throw(this,&Error::typeinfo,Error::~Error);
}

Assistant:

bool Filter::fnmatch(std::string const & pattern, std::string const & string, bool icase)
{
#if defined(_UNIX)
	// POSIX fnmatch
	int const rval = ::fnmatch(pattern.c_str(), string.c_str(), icase ? FNM_CASEFOLD : 0);
	if (rval != 0 && rval != FNM_NOMATCH) {
		THROW_ERROR("Invalid pattern \"{}\" : {}", pattern, strerror(errno));
	}
	return (rval == 0);
#endif
#if defined(_WIN32)
	return PathMatchSpecA(string.c_str(), pattern.c_str());
#endif
}